

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrologEncoderMD.cpp
# Opt level: O2

uchar PrologEncoderMD::GetRequiredNodeCountForAlloca(size_t size)

{
  code *pcVar1;
  uint lineNumber;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  char *message;
  char *error;
  
  if (size == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(size)";
    message = "size";
    lineNumber = 10;
  }
  else {
    if ((size & 7) == 0) goto LAB_005d2380;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    error = "(size % 8 == 0)";
    message = "size % 8 == 0";
    lineNumber = 0xb;
  }
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                     ,lineNumber,error,message);
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_005d2380:
  bVar3 = 1;
  if (0x80 < size) {
    bVar3 = size < 0x7ff9 ^ 3;
  }
  return bVar3;
}

Assistant:

unsigned __int8 PrologEncoderMD::GetRequiredNodeCountForAlloca(size_t size)
{
    Assert(size);
    Assert(size % 8 == 0);

    if (size <= 0x80)
        return 1;
    else if (size <= 0x7FF8)
        return 2;
    else
        return 3;
}